

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O1

uint * __thiscall
Hpipe::Vec<unsigned_int>::push_back_unique<unsigned_int_const&>(Vec<unsigned_int> *this,uint *val)

{
  iterator __position;
  ulong uVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  bVar5 = (long)__position._M_current - (long)puVar2 != 0;
  if (bVar5) {
    if (*puVar2 == *val) {
      uVar4 = 0;
    }
    else {
      uVar3 = (long)__position._M_current - (long)puVar2 >> 2;
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        bVar5 = uVar4 < uVar3;
        if (uVar3 <= uVar4) goto LAB_0016c8e3;
        uVar1 = (ulong)((int)uVar4 + 1);
      } while (puVar2[uVar4] != *val);
    }
    puVar2 = puVar2 + uVar4;
  }
LAB_0016c8e3:
  if (!bVar5) {
    if (__position._M_current ==
        (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,__position,val);
    }
    else {
      *__position._M_current = *val;
      (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
  }
  return puVar2;
}

Assistant:

T       *push_back_unique     ( Arg &&val ) { for( unsigned i = 0; i < this->size(); ++i ) if ( this->operator[]( i ) == val ) return &this->operator[]( i ); return push_back( std::forward<Arg>( val ) ); }